

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O0

Result __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::calculate<false>
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,
          Trajectory<3UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  value_type_conflict2 vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  value_type vVar11;
  double dVar12;
  Direction limiting_direction;
  undefined8 uVar13;
  byte bVar14;
  bool bVar15;
  __optional_eq_t<unsigned_long,_unsigned_long> _Var16;
  uint uVar17;
  reference pvVar18;
  Block *this_00;
  const_reference pvVar19;
  reference pvVar20;
  array<double,_3UL> *paVar21;
  array<ruckig::ControlInterface,_3UL> *this_01;
  const_reference pvVar22;
  reference pvVar23;
  array<ruckig::Synchronization,_3UL> *this_02;
  const_reference pvVar24;
  reference pvVar25;
  const_reference pvVar26;
  reference pvVar27;
  reference pvVar28;
  reference pvVar29;
  reference pvVar30;
  reference pvVar31;
  reference pvVar32;
  reference pvVar33;
  iterator pvVar34;
  iterator pvVar35;
  unsigned_long *puVar36;
  Interval *pIVar37;
  Vector<double> *pVVar38;
  StandardVector<Block,_3UL> *this_03;
  optional<ruckig::Block::Interval> *poVar39;
  double dVar40;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  optional<double> t_min;
  byte local_23a1;
  value_type local_1f4c;
  value_type local_1f44;
  value_type_conflict2 local_1f38;
  value_type_conflict2 local_1f28;
  undefined1 local_1f18 [8];
  VelocitySecondOrderStep2 step2_4;
  undefined1 local_1ef8 [8];
  VelocityThirdOrderStep2 step2_3;
  undefined1 local_1eb8 [8];
  PositionFirstOrderStep2 step2_2;
  undefined1 local_1e98 [8];
  PositionSecondOrderStep2 step2_1;
  undefined1 local_1e50 [8];
  PositionThirdOrderStep2 step2;
  byte local_1d39;
  bool found_time_synchronization_1;
  double t_profile_1;
  Profile *p_2;
  double dStack_1d20;
  bool skip_synchronization;
  size_t dof_5;
  double local_1d10;
  double t_profile;
  Profile *p_1;
  size_t dof_4;
  reference pvStack_1cf0;
  bool found_time_synchronization;
  Profile *p_limiting;
  double local_1ce0;
  size_t dof_3;
  _Storage<unsigned_long,_true> local_1cd0;
  double local_1cc8;
  size_t dof_2;
  size_t dof_1;
  _Storage<double,_true> _Stack_1cb0;
  bool has_zero_limits_1;
  undefined1 local_1ca8;
  undefined7 uStack_1ca7;
  undefined1 local_1c99;
  _Storage<unsigned_long,_true> _Stack_1c98;
  bool found_synchronization;
  optional<unsigned_long> limiting_dof;
  undefined1 local_1c80 [6];
  bool discrete_duration;
  bool has_zero_limits;
  VelocitySecondOrderStep1 step1_4;
  undefined1 local_1c68 [8];
  VelocityThirdOrderStep1 step1_3;
  undefined1 local_1578 [8];
  PositionFirstOrderStep1 step1_2;
  undefined1 local_1560 [8];
  PositionSecondOrderStep1 step1_1;
  undefined1 local_e68 [8];
  PositionThirdOrderStep1 step1;
  byte local_4b;
  bool found_profile;
  value_type *p;
  size_t dof;
  bool *was_interrupted_local;
  double delta_time_local;
  Trajectory<3UL,_ruckig::StandardVector> *traj_local;
  InputParameter<3UL,_ruckig::StandardVector> *inp_local;
  TargetCalculator<3UL,_ruckig::StandardVector> *this_local;
  
  *was_interrupted = false;
  Trajectory<3UL,_ruckig::StandardVector>::resize<3UL,_0>(traj,0);
  for (p = (value_type *)0x0; p < (value_type *)this->degrees_of_freedom;
      p = (value_type *)((long)(p->t)._M_elems + 1)) {
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
              ::operator[](&traj->profiles,0);
    this_00 = (Block *)std::array<ruckig::Profile,_3UL>::operator[](pvVar18,(size_type)p);
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->min_velocity);
    if (bVar15) {
      paVar21 = std::optional<std::array<double,_3UL>_>::value(&inp->min_velocity);
      pvVar19 = std::array<double,_3UL>::operator[](paVar21,(size_type)p);
      local_1f28 = *pvVar19;
    }
    else {
      pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
      local_1f28 = -*pvVar19;
    }
    pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
    *pvVar20 = local_1f28;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->min_acceleration);
    if (bVar15) {
      paVar21 = std::optional<std::array<double,_3UL>_>::value(&inp->min_acceleration);
      pvVar19 = std::array<double,_3UL>::operator[](paVar21,(size_type)p);
      local_1f38 = *pvVar19;
    }
    else {
      pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
      local_1f38 = -*pvVar19;
    }
    pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
    *pvVar20 = local_1f38;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_control_interface);
    if (bVar15) {
      this_01 = std::optional<std::array<ruckig::ControlInterface,_3UL>_>::value
                          (&inp->per_dof_control_interface);
      pvVar22 = std::array<ruckig::ControlInterface,_3UL>::operator[](this_01,(size_type)p);
      local_1f44 = *pvVar22;
    }
    else {
      local_1f44 = inp->control_interface;
    }
    pvVar23 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                        (&this->inp_per_dof_control_interface,(size_type)p);
    *pvVar23 = local_1f44;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_synchronization);
    if (bVar15) {
      this_02 = std::optional<std::array<ruckig::Synchronization,_3UL>_>::value
                          (&inp->per_dof_synchronization);
      pvVar24 = std::array<ruckig::Synchronization,_3UL>::operator[](this_02,(size_type)p);
      local_1f4c = *pvVar24;
    }
    else {
      local_1f4c = inp->synchronization;
    }
    pvVar25 = std::array<ruckig::Synchronization,_3UL>::operator[]
                        (&this->inp_per_dof_synchronization,(size_type)p);
    *pvVar25 = local_1f4c;
    pvVar26 = std::array<bool,_3UL>::operator[](&inp->enabled,(size_type)p);
    if ((*pvVar26 & 1U) == 0) {
      pvVar19 = std::array<double,_3UL>::operator[](&inp->current_position,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).p);
      *pvVar27 = vVar1;
      pvVar19 = std::array<double,_3UL>::operator[](&inp->current_velocity,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).v);
      *pvVar27 = vVar1;
      pvVar19 = std::array<double,_3UL>::operator[](&inp->current_acceleration,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).a);
      *pvVar27 = vVar1;
      pvVar28 = std::array<double,_7UL>::back(&(this_00->p_min).t_sum);
      *pvVar28 = 0.0;
      pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
      pvVar29->t_min = 0.0;
      pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar29->a);
      pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar29->b);
    }
    else {
      pvVar23 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                          (&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar23 == Position) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar19 = std::array<double,_3UL>::operator[](&inp->current_velocity,(size_type)p);
          dVar40 = *pvVar19;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->current_acceleration,(size_type)p);
          dVar6 = *pvVar19;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
          dVar7 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
          dVar8 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar9 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar10 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::BrakeProfile::get_position_brake_trajectory
                    (dVar40,dVar6,dVar7,dVar8,dVar9,dVar10,*pvVar19);
        }
        else {
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          uVar17 = std::isinf(*pvVar19);
          if ((uVar17 & 1) == 0) {
            pvVar19 = std::array<double,_3UL>::operator[](&inp->current_velocity,(size_type)p);
            dVar40 = *pvVar19;
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar6 = *pvVar19;
            pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
            dVar7 = *pvVar20;
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
            dVar8 = *pvVar19;
            pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      (dVar40,dVar6,dVar7,dVar8,*pvVar20);
          }
        }
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_position,(size_type)p);
        dVar40 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_velocity,(size_type)p);
        dVar6 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_acceleration,(size_type)p);
        dVar7 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->target_position,(size_type)p);
        dVar8 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->target_velocity,(size_type)p);
        dVar9 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->target_acceleration,(size_type)p);
        Profile::set_boundary((Profile *)this_00,dVar40,dVar6,dVar7,dVar8,dVar9,*pvVar19);
      }
      else if (*pvVar23 == Velocity) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar19 = std::array<double,_3UL>::operator[](&inp->current_acceleration,(size_type)p);
          dVar40 = *pvVar19;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar6 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar7 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::BrakeProfile::get_velocity_brake_trajectory(dVar40,dVar6,dVar7,*pvVar19);
        }
        else {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_position,(size_type)p);
        dVar40 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_velocity,(size_type)p);
        dVar6 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->current_acceleration,(size_type)p);
        dVar7 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->target_velocity,(size_type)p);
        dVar8 = *pvVar19;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->target_acceleration,(size_type)p);
        Profile::set_boundary_for_velocity((Profile *)this_00,dVar40,dVar6,dVar7,dVar8,*pvVar19);
      }
      pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
      uVar17 = std::isinf(*pvVar19);
      if ((uVar17 & 1) == 0) {
        pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
        pvVar30 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
        pvVar31 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
        BrakeProfile::finalize(&(this_00->p_min).brake,pvVar27,pvVar30,pvVar31);
      }
      else {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          pvVar30 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          pvVar31 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          BrakeProfile::finalize_second_order(&(this_00->p_min).brake,pvVar27,pvVar30,pvVar31);
        }
      }
      local_4b = 0;
      pvVar23 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                          (&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar23 == Position) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          dVar40 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar6 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar7 = *pvVar27;
          dVar8 = (this_00->p_min).pf;
          dVar9 = (this_00->p_min).vf;
          dVar10 = (this_00->p_min).af;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
          dVar2 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
          dVar3 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar4 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar5 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)local_e68,dVar40,dVar6,dVar7,dVar8,dVar9,dVar10,
                     dVar2,dVar3,dVar4,dVar5,*pvVar19);
          std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::PositionThirdOrderStep1::get_profile((Profile *)local_e68,this_00);
        }
        else {
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          uVar17 = std::isinf(*pvVar19);
          if ((uVar17 & 1) == 0) {
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar40 = *pvVar27;
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
            dVar6 = *pvVar27;
            dVar7 = (this_00->p_min).pf;
            dVar8 = (this_00->p_min).vf;
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar9 = *pvVar19;
            pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
            dVar10 = *pvVar20;
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
            dVar2 = *pvVar19;
            pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)local_1560,dVar40,dVar6,dVar7,dVar8,dVar9,dVar10,
                       dVar2,*pvVar20);
            std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
            local_4b = ruckig::PositionSecondOrderStep1::get_profile((Profile *)local_1560,this_00);
          }
          else {
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar40 = *pvVar27;
            dVar6 = (this_00->p_min).pf;
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar7 = *pvVar19;
            pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_velocity,(size_type)p);
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      ((PositionFirstOrderStep1 *)local_1578,dVar40,dVar6,dVar7,*pvVar20);
            std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
            local_4b = ruckig::PositionFirstOrderStep1::get_profile((Profile *)local_1578,this_00);
          }
        }
        local_4b = local_4b & 1;
      }
      else if (*pvVar23 == Velocity) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar40 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar6 = *pvVar27;
          dVar7 = (this_00->p_min).vf;
          dVar8 = (this_00->p_min).af;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar9 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar10 = *pvVar20;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)local_1c68,dVar40,dVar6,dVar7,dVar8,dVar9,dVar10,
                     *pvVar19);
          std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)local_1c68,this_00);
        }
        else {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar40 = *pvVar27;
          dVar6 = (this_00->p_min).vf;
          pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar7 = *pvVar19;
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)local_1c80,dVar40,dVar6,dVar7,*pvVar20);
          std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)local_1c80,this_00);
        }
        local_4b = local_4b & 1;
      }
      if (local_4b == 0) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,(size_type)p);
        bVar15 = true;
        if ((*pvVar19 != 0.0) || (NAN(*pvVar19))) {
          pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          bVar15 = true;
          if ((*pvVar20 != 0.0) || (NAN(*pvVar20))) {
            pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p);
            bVar15 = *pvVar19 == 0.0;
          }
        }
        if (bVar15) {
          return ErrorZeroLimits;
        }
        return ErrorExecutionTimeCalculation;
      }
      pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)p);
      dVar40 = pvVar29->t_min;
      pvVar20 = std::array<double,_3UL>::operator[](&traj->independent_min_durations,(size_type)p);
      *pvVar20 = dVar40;
    }
  }
  limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._14_1_ = inp->duration_discretization == Discrete;
  if (((this->degrees_of_freedom != 1) ||
      (bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->minimum_duration), bVar15))
     || ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._14_1_ & 1) != 0)) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&stack0xffffffffffffe368);
    _Stack_1cb0 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
    uVar13 = *(undefined8 *)
              &(inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
    local_1ca8 = (undefined1)uVar13;
    uStack_1ca7 = (undefined7)((ulong)uVar13 >> 8);
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
              ::operator[](&traj->profiles,0);
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = (bool)local_1ca8;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = _Stack_1cb0;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = 0;
    local_1c99 = synchronize(this,t_min,&traj->duration,
                             (optional<unsigned_long> *)&stack0xffffffffffffe368,pvVar18,
                             (bool)(limiting_dof.super__Optional_base<unsigned_long,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_long>._14_1_ &
                                   1),delta_time);
    if ((bool)local_1c99) {
      for (local_1cc8 = 0.0; (ulong)local_1cc8 < this->degrees_of_freedom;
          local_1cc8 = (double)((long)local_1cc8 + 1)) {
        pvVar26 = std::array<bool,_3UL>::operator[](&inp->enabled,(size_type)local_1cc8);
        if (((*pvVar26 & 1U) != 0) &&
           (pvVar25 = std::array<ruckig::Synchronization,_3UL>::operator[]
                                (&this->inp_per_dof_synchronization,(size_type)local_1cc8),
           *pvVar25 == None)) {
          pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)local_1cc8);
          pvVar18 = std::
                    vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ::operator[](&traj->profiles,0);
          pvVar32 = std::array<ruckig::Profile,_3UL>::operator[](pvVar18,(size_type)local_1cc8);
          memcpy(pvVar32,pvVar29,0x23c);
          pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,(size_type)local_1cc8);
          if (traj->duration <= pvVar29->t_min && pvVar29->t_min != traj->duration) {
            pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                (&this->blocks,(size_type)local_1cc8);
            traj->duration = pvVar29->t_min;
            std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                      ((optional<unsigned_long> *)&dof_3,(unsigned_long *)&local_1cc8);
            _Stack_1c98._M_value = dof_3;
            limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload = local_1cd0;
          }
        }
      }
      vVar11 = traj->duration;
      pvVar33 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
      *pvVar33 = vVar11;
      if (traj->duration <= 7600.0) {
        if ((traj->duration != 0.0) || (NAN(traj->duration))) {
          if ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._14_1_ & 1) == 0) {
            pvVar34 = std::array<ruckig::Synchronization,_3UL>::begin
                                (&this->inp_per_dof_synchronization);
            pvVar35 = std::array<ruckig::Synchronization,_3UL>::end
                                (&this->inp_per_dof_synchronization);
            bVar15 = std::
                     all_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                               (pvVar34,pvVar35);
            if (bVar15) {
              return Working;
            }
          }
          bVar15 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffe368);
          if (bVar15) {
            pvVar34 = std::array<ruckig::Synchronization,_3UL>::begin
                                (&this->inp_per_dof_synchronization);
            pvVar35 = std::array<ruckig::Synchronization,_3UL>::end
                                (&this->inp_per_dof_synchronization);
            bVar15 = std::
                     any_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                               (pvVar34,pvVar35);
            if (bVar15) {
              pvVar18 = std::
                        vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                        ::operator[](&traj->profiles,0);
              puVar36 = std::optional<unsigned_long>::value
                                  ((optional<unsigned_long> *)&stack0xffffffffffffe368);
              pvStack_1cf0 = std::array<ruckig::Profile,_3UL>::operator[](pvVar18,*puVar36);
              limiting_direction = pvStack_1cf0->direction;
              puVar36 = std::optional<unsigned_long>::value
                                  ((optional<unsigned_long> *)&stack0xffffffffffffe368);
              bVar15 = is_input_collinear(this,inp,limiting_direction,*puVar36);
              if (bVar15) {
                dof_4._7_1_ = 1;
                for (p_1 = (Profile *)0x0; p_1 < (Profile *)this->degrees_of_freedom;
                    p_1 = (Profile *)((long)(p_1->t)._M_elems + 1)) {
                  pvVar26 = std::array<bool,_3UL>::operator[](&inp->enabled,(size_type)p_1);
                  if ((((*pvVar26 & 1U) != 0) &&
                      (_Var16 = std::operator==((unsigned_long *)&p_1,
                                                (optional<unsigned_long> *)&stack0xffffffffffffe368)
                      , !_Var16)) &&
                     (pvVar25 = std::array<ruckig::Synchronization,_3UL>::operator[]
                                          (&this->inp_per_dof_synchronization,(size_type)p_1),
                     *pvVar25 == Phase)) {
                    pvVar18 = std::
                              vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                              ::operator[](&traj->profiles,0);
                    t_profile = (double)std::array<ruckig::Profile,_3UL>::operator[]
                                                  (pvVar18,(size_type)p_1);
                    local_1d10 = (traj->duration - (((reference)t_profile)->brake).duration) -
                                 (((reference)t_profile)->accel).duration;
                    (((reference)t_profile)->t)._M_elems[6] = (pvStack_1cf0->t)._M_elems[6];
                    dVar40 = (pvStack_1cf0->t)._M_elems[0];
                    dVar6 = (pvStack_1cf0->t)._M_elems[1];
                    dVar7 = (pvStack_1cf0->t)._M_elems[2];
                    dVar8 = (pvStack_1cf0->t)._M_elems[3];
                    dVar9 = (pvStack_1cf0->t)._M_elems[5];
                    (((reference)t_profile)->t)._M_elems[4] = (pvStack_1cf0->t)._M_elems[4];
                    (((reference)t_profile)->t)._M_elems[5] = dVar9;
                    (((reference)t_profile)->t)._M_elems[2] = dVar7;
                    (((reference)t_profile)->t)._M_elems[3] = dVar8;
                    (((reference)t_profile)->t)._M_elems[0] = dVar40;
                    (((reference)t_profile)->t)._M_elems[1] = dVar6;
                    ((reference)t_profile)->control_signs = pvStack_1cf0->control_signs;
                    pvVar23 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                                        (&this->inp_per_dof_control_interface,(size_type)p_1);
                    if (*pvVar23 == Position) {
                      if (*(int *)((long)t_profile + 0x238) == 0) {
                        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        uVar17 = std::isinf(*pvVar19);
                        dVar6 = t_profile;
                        dVar40 = local_1d10;
                        if ((uVar17 & 1) == 0) {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_velocity,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_velocity,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar10 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          dVar2 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_jerk,(size_type)p_1);
                          bVar15 = Profile::
                                   check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,dVar9,dVar10,dVar2
                                              ,*pvVar19);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        else {
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          uVar17 = std::isinf(*pvVar19);
                          dVar6 = t_profile;
                          dVar40 = local_1d10;
                          if ((uVar17 & 1) == 0) {
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->new_phase_control,(size_type)p_1);
                            dVar7 = *pvVar20;
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->new_phase_control,(size_type)p_1);
                            vVar1 = *pvVar20;
                            pvVar19 = std::array<double,_3UL>::operator[]
                                                (&inp->max_velocity,(size_type)p_1);
                            dVar8 = *pvVar19;
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->inp_min_velocity,(size_type)p_1);
                            dVar9 = *pvVar20;
                            pvVar19 = std::array<double,_3UL>::operator[]
                                                (&inp->max_acceleration,(size_type)p_1);
                            dVar10 = *pvVar19;
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->inp_min_acceleration,(size_type)p_1);
                            bVar15 = Profile::
                                     check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                               ((Profile *)dVar6,dVar40,dVar7,-vVar1,dVar8,dVar9,
                                                dVar10,*pvVar20);
                            bVar14 = dof_4._7_1_ & 1 & bVar15;
                          }
                          else {
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->new_phase_control,(size_type)p_1);
                            dVar7 = *pvVar20;
                            pvVar19 = std::array<double,_3UL>::operator[]
                                                (&inp->max_velocity,(size_type)p_1);
                            dVar8 = *pvVar19;
                            pvVar20 = std::array<double,_3UL>::operator[]
                                                (&this->inp_min_velocity,(size_type)p_1);
                            bVar15 = Profile::
                                     check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                               ((Profile *)dVar6,dVar40,dVar7,dVar8,*pvVar20);
                            bVar14 = dof_4._7_1_ & 1 & bVar15;
                          }
                        }
                        dof_4._7_1_ = bVar14 != 0;
                      }
                      else if (*(int *)((long)t_profile + 0x238) == 1) {
                        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        uVar17 = std::isinf(*pvVar19);
                        dVar6 = t_profile;
                        dVar40 = local_1d10;
                        if ((uVar17 & 1) == 0) {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_velocity,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_velocity,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar10 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          dVar2 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_jerk,(size_type)p_1);
                          bVar15 = Profile::
                                   check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,dVar9,dVar10,dVar2
                                              ,*pvVar19);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        else {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          vVar1 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_velocity,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_velocity,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar10 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,-vVar1,dVar8,dVar9,
                                              dVar10,*pvVar20);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        dof_4._7_1_ = bVar14 != 0;
                      }
                    }
                    else if (*pvVar23 == Velocity) {
                      if (*(int *)((long)t_profile + 0x238) == 0) {
                        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        uVar17 = std::isinf(*pvVar19);
                        dVar6 = t_profile;
                        dVar40 = local_1d10;
                        if ((uVar17 & 1) == 0) {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_jerk,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,dVar9,*pvVar19);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        else {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,*pvVar20);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        dof_4._7_1_ = bVar14 != 0;
                      }
                      else if (*(int *)((long)t_profile + 0x238) == 1) {
                        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        uVar17 = std::isinf(*pvVar19);
                        dVar6 = t_profile;
                        dVar40 = local_1d10;
                        if ((uVar17 & 1) == 0) {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_jerk,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,dVar9,*pvVar19);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        else {
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_3UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_3UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar40,dVar7,dVar8,*pvVar20);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        dof_4._7_1_ = bVar14 != 0;
                      }
                    }
                    *(ReachedLimits *)((long)t_profile + 0x230) = pvStack_1cf0->limits;
                  }
                }
                if ((dof_4._7_1_ & 1) != 0) {
                  pvVar34 = std::array<ruckig::Synchronization,_3UL>::begin
                                      (&this->inp_per_dof_synchronization);
                  pvVar35 = std::array<ruckig::Synchronization,_3UL>::end
                                      (&this->inp_per_dof_synchronization);
                  bVar15 = std::
                           all_of<ruckig::Synchronization*,ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                                     (pvVar34,pvVar35);
                  if (bVar15) {
                    return Working;
                  }
                }
              }
            }
          }
          for (dStack_1d20 = 0.0; (ulong)dStack_1d20 < this->degrees_of_freedom;
              dStack_1d20 = (double)((long)dStack_1d20 + 1)) {
            _Var16 = std::operator==((unsigned_long *)&stack0xffffffffffffe2e0,
                                     (optional<unsigned_long> *)&stack0xffffffffffffe368);
            if (_Var16) {
LAB_0013a9c0:
              local_23a1 = limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._14_1_ ^ 0xff;
            }
            else {
              pvVar25 = std::array<ruckig::Synchronization,_3UL>::operator[]
                                  (&this->inp_per_dof_synchronization,(size_type)dStack_1d20);
              local_23a1 = 0;
              if (*pvVar25 == None) goto LAB_0013a9c0;
            }
            pvVar26 = std::array<bool,_3UL>::operator[](&inp->enabled,(size_type)dStack_1d20);
            if (((*pvVar26 & 1U) != 0) && ((local_23a1 & 1) == 0)) {
              pvVar18 = std::
                        vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                        ::operator[](&traj->profiles,0);
              pvVar32 = std::array<ruckig::Profile,_3UL>::operator[](pvVar18,(size_type)dStack_1d20)
              ;
              dVar40 = (traj->duration - (pvVar32->brake).duration) - (pvVar32->accel).duration;
              pvVar25 = std::array<ruckig::Synchronization,_3UL>::operator[]
                                  (&this->inp_per_dof_synchronization,(size_type)dStack_1d20);
              if (*pvVar25 == TimeIfNecessary) {
                pVVar38 = &inp->target_velocity;
                std::array<double,_3UL>::operator[](pVVar38,(size_type)dStack_1d20);
                std::abs((int)pVVar38);
                if (extraout_XMM0_Qa < 2.220446049250313e-16) {
                  pVVar38 = &inp->target_acceleration;
                  std::array<double,_3UL>::operator[](pVVar38,(size_type)dStack_1d20);
                  std::abs((int)pVVar38);
                  if (extraout_XMM0_Qa_00 < 2.220446049250313e-16) {
                    pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                        (&this->blocks,(size_type)dStack_1d20);
                    memcpy(pvVar32,pvVar29,0x23c);
                    goto LAB_0013b493;
                  }
                }
              }
              this_03 = &this->blocks;
              std::array<ruckig::Block,_3UL>::operator[](this_03,(size_type)dStack_1d20);
              std::abs((int)this_03);
              if (4.440892098500626e-16 <= extraout_XMM0_Qa_01) {
                pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                    (&this->blocks,(size_type)dStack_1d20);
                bVar15 = std::optional::operator_cast_to_bool((optional *)&pvVar29->a);
                if (bVar15) {
                  pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                      (&this->blocks,(size_type)dStack_1d20);
                  poVar39 = &pvVar29->a;
                  std::optional<ruckig::Block::Interval>::operator->(poVar39);
                  std::abs((int)poVar39);
                  if (extraout_XMM0_Qa_02 < 4.440892098500626e-16) {
                    pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                        (&this->blocks,(size_type)dStack_1d20);
                    pIVar37 = std::optional<ruckig::Block::Interval>::operator->(&pvVar29->a);
                    memcpy(pvVar32,pIVar37 + 0x10,0x23c);
                    goto LAB_0013b493;
                  }
                }
                pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                    (&this->blocks,(size_type)dStack_1d20);
                bVar15 = std::optional::operator_cast_to_bool((optional *)&pvVar29->b);
                if (bVar15) {
                  pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                      (&this->blocks,(size_type)dStack_1d20);
                  poVar39 = &pvVar29->b;
                  std::optional<ruckig::Block::Interval>::operator->(poVar39);
                  std::abs((int)poVar39);
                  if (extraout_XMM0_Qa_03 < 4.440892098500626e-16) {
                    pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                        (&this->blocks,(size_type)dStack_1d20);
                    pIVar37 = std::optional<ruckig::Block::Interval>::operator->(&pvVar29->b);
                    memcpy(pvVar32,pIVar37 + 0x10,0x23c);
                    goto LAB_0013b493;
                  }
                }
                local_1d39 = 0;
                pvVar23 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                                    (&this->inp_per_dof_control_interface,(size_type)dStack_1d20);
                if (*pvVar23 == Position) {
                  pvVar19 = std::array<double,_3UL>::operator[]
                                      (&inp->max_jerk,(size_type)dStack_1d20);
                  uVar17 = std::isinf(*pvVar19);
                  if ((uVar17 & 1) == 0) {
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->p,0);
                    dVar6 = *pvVar27;
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->v,0);
                    dVar7 = *pvVar27;
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->a,0);
                    dVar8 = *pvVar27;
                    dVar9 = pvVar32->pf;
                    dVar10 = pvVar32->vf;
                    dVar2 = pvVar32->af;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_velocity,(size_type)dStack_1d20);
                    dVar3 = *pvVar19;
                    pvVar20 = std::array<double,_3UL>::operator[]
                                        (&this->inp_min_velocity,(size_type)dStack_1d20);
                    dVar4 = *pvVar20;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_acceleration,(size_type)dStack_1d20);
                    dVar5 = *pvVar19;
                    pvVar20 = std::array<double,_3UL>::operator[]
                                        (&this->inp_min_acceleration,(size_type)dStack_1d20);
                    dVar12 = *pvVar20;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_jerk,(size_type)dStack_1d20);
                    ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                              ((PositionThirdOrderStep2 *)local_1e50,dVar40,dVar6,dVar7,dVar8,dVar9,
                               dVar10,dVar2,dVar3,dVar4,dVar5,dVar12,*pvVar19);
                    local_1d39 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)local_1e50)
                    ;
                  }
                  else {
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_acceleration,(size_type)dStack_1d20);
                    uVar17 = std::isinf(*pvVar19);
                    if ((uVar17 & 1) == 0) {
                      pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->p,0);
                      dVar6 = *pvVar27;
                      pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->v,0);
                      dVar7 = *pvVar27;
                      dVar8 = pvVar32->pf;
                      dVar9 = pvVar32->vf;
                      pvVar19 = std::array<double,_3UL>::operator[]
                                          (&inp->max_velocity,(size_type)dStack_1d20);
                      dVar10 = *pvVar19;
                      pvVar20 = std::array<double,_3UL>::operator[]
                                          (&this->inp_min_velocity,(size_type)dStack_1d20);
                      dVar2 = *pvVar20;
                      pvVar19 = std::array<double,_3UL>::operator[]
                                          (&inp->max_acceleration,(size_type)dStack_1d20);
                      dVar3 = *pvVar19;
                      pvVar20 = std::array<double,_3UL>::operator[]
                                          (&this->inp_min_acceleration,(size_type)dStack_1d20);
                      ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                                ((PositionSecondOrderStep2 *)local_1e98,dVar40,dVar6,dVar7,dVar8,
                                 dVar9,dVar10,dVar2,dVar3,*pvVar20);
                      local_1d39 = ruckig::PositionSecondOrderStep2::get_profile
                                             ((Profile *)local_1e98);
                    }
                    else {
                      pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->p,0);
                      dVar6 = *pvVar27;
                      dVar7 = pvVar32->pf;
                      pvVar19 = std::array<double,_3UL>::operator[]
                                          (&inp->max_velocity,(size_type)dStack_1d20);
                      dVar8 = *pvVar19;
                      pvVar20 = std::array<double,_3UL>::operator[]
                                          (&this->inp_min_velocity,(size_type)dStack_1d20);
                      ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                                ((PositionFirstOrderStep2 *)local_1eb8,dVar40,dVar6,dVar7,dVar8,
                                 *pvVar20);
                      local_1d39 = ruckig::PositionFirstOrderStep2::get_profile
                                             ((Profile *)local_1eb8);
                    }
                  }
                  local_1d39 = local_1d39 & 1;
                }
                else if (*pvVar23 == Velocity) {
                  pvVar19 = std::array<double,_3UL>::operator[]
                                      (&inp->max_jerk,(size_type)dStack_1d20);
                  uVar17 = std::isinf(*pvVar19);
                  if ((uVar17 & 1) == 0) {
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->v,0);
                    dVar6 = *pvVar27;
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->a,0);
                    dVar7 = *pvVar27;
                    dVar8 = pvVar32->vf;
                    dVar9 = pvVar32->af;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_acceleration,(size_type)dStack_1d20);
                    dVar10 = *pvVar19;
                    pvVar20 = std::array<double,_3UL>::operator[]
                                        (&this->inp_min_acceleration,(size_type)dStack_1d20);
                    dVar2 = *pvVar20;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_jerk,(size_type)dStack_1d20);
                    ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                              ((VelocityThirdOrderStep2 *)local_1ef8,dVar40,dVar6,dVar7,dVar8,dVar9,
                               dVar10,dVar2,*pvVar19);
                    local_1d39 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)local_1ef8)
                    ;
                  }
                  else {
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar32->v,0);
                    dVar6 = *pvVar27;
                    dVar7 = pvVar32->vf;
                    pvVar19 = std::array<double,_3UL>::operator[]
                                        (&inp->max_acceleration,(size_type)dStack_1d20);
                    dVar8 = *pvVar19;
                    pvVar20 = std::array<double,_3UL>::operator[]
                                        (&this->inp_min_acceleration,(size_type)dStack_1d20);
                    ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                              ((VelocitySecondOrderStep2 *)local_1f18,dVar40,dVar6,dVar7,dVar8,
                               *pvVar20);
                    local_1d39 = ruckig::VelocitySecondOrderStep2::get_profile
                                           ((Profile *)local_1f18);
                  }
                  local_1d39 = local_1d39 & 1;
                }
                if (local_1d39 == 0) {
                  return ErrorSynchronizationCalculation;
                }
              }
              else {
                pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                    (&this->blocks,(size_type)dStack_1d20);
                memcpy(pvVar32,pvVar29,0x23c);
              }
            }
LAB_0013b493:
          }
          this_local._4_4_ = Working;
        }
        else {
          for (local_1ce0 = 0.0; (ulong)local_1ce0 < this->degrees_of_freedom;
              local_1ce0 = (double)((long)local_1ce0 + 1)) {
            pvVar29 = std::array<ruckig::Block,_3UL>::operator[]
                                (&this->blocks,(size_type)local_1ce0);
            pvVar18 = std::
                      vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                      ::operator[](&traj->profiles,0);
            pvVar32 = std::array<ruckig::Profile,_3UL>::operator[](pvVar18,(size_type)local_1ce0);
            memcpy(pvVar32,pvVar29,0x23c);
          }
          this_local._4_4_ = Working;
        }
      }
      else {
        this_local._4_4_ = ErrorTrajectoryDuration;
      }
    }
    else {
      dof_1._7_1_ = 0;
      for (dof_2 = 0; dof_2 < this->degrees_of_freedom; dof_2 = dof_2 + 1) {
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_acceleration,dof_2);
        if ((*pvVar19 == 0.0) && (!NAN(*pvVar19))) {
LAB_001398ef:
          dof_1._7_1_ = 1;
          break;
        }
        pvVar20 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,dof_2);
        if ((*pvVar20 == 0.0) && (!NAN(*pvVar20))) goto LAB_001398ef;
        pvVar19 = std::array<double,_3UL>::operator[](&inp->max_jerk,dof_2);
        if ((*pvVar19 == 0.0) && (!NAN(*pvVar19))) goto LAB_001398ef;
      }
      if ((dof_1._7_1_ & 1) == 0) {
        this_local._4_4_ = ErrorSynchronizationCalculation;
      }
      else {
        this_local._4_4_ = ErrorZeroLimits;
      }
    }
  }
  else {
    pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,0);
    traj->duration = pvVar29->t_min;
    pvVar29 = std::array<ruckig::Block,_3UL>::operator[](&this->blocks,0);
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
              ::operator[](&traj->profiles,0);
    pvVar32 = std::array<ruckig::Profile,_3UL>::operator[](pvVar18,0);
    memcpy(pvVar32,pvVar29,0x23c);
    vVar11 = traj->duration;
    pvVar33 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
    *pvVar33 = vVar11;
    this_local._4_4_ = Working;
  }
  return this_local._4_4_;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }